

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLoader.cxx
# Opt level: O0

SymbolPointer cmsys::DynamicLoader::GetSymbolAddress(LibraryHandle lib,string *sym)

{
  undefined8 uVar1;
  SymbolPointer p_Var2;
  anon_union_8_2_50f5de50 result;
  string *sym_local;
  LibraryHandle lib_local;
  
  uVar1 = std::__cxx11::string::c_str();
  p_Var2 = (SymbolPointer)dlsym(lib,uVar1);
  return p_Var2;
}

Assistant:

DynamicLoader::SymbolPointer DynamicLoader::GetSymbolAddress(
  DynamicLoader::LibraryHandle lib, const std::string& sym)
{
  // Hack to cast pointer-to-data to pointer-to-function.
  union
  {
    void* pvoid;
    DynamicLoader::SymbolPointer psym;
  } result;
  result.pvoid = dlsym(lib, sym.c_str());
  return result.psym;
}